

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

bool __thiscall phyr::Sphere::intersectRay(Sphere *this,Ray *ray,bool testAlpha)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FPError a_00;
  FPError b_00;
  FPError c_00;
  Sphere *pSVar4;
  bool bVar5;
  FPError *pFVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  FPError t2;
  FPError t1;
  Ray lr;
  FPError c;
  FPError oy;
  FPError ox;
  FPError b;
  FPError a;
  FPError oz;
  Vector3f rdErr;
  Vector3f roErr;
  FPError dz;
  FPError dy;
  FPError dx;
  FPError local_248;
  Sphere *local_230;
  FPError local_228;
  Ray local_210;
  FPError local_1d8;
  FPError local_1c0;
  FPError local_1a8;
  FPError local_190;
  FPError local_178;
  FPError local_160;
  FPError local_148;
  FPError local_130;
  Vector3f local_118;
  Vector3f local_f8;
  FPError local_d8;
  FPError local_c0;
  FPError local_a8;
  FPError local_90;
  FPError local_78;
  FPError local_60;
  FPError local_48;
  
  local_f8.z = 0.0;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_118.z = 0.0;
  local_230 = this;
  Transform::operator()(&local_210,(this->super_Shape).worldToLocal,ray,&local_f8,&local_118);
  FPError::FPError(&local_1a8,local_210.o.x,local_f8.x);
  FPError::FPError(&local_1c0,local_210.o.y,local_f8.y);
  FPError::FPError(&local_130,local_210.o.z,local_f8.z);
  FPError::FPError(&local_48,local_210.d.x,local_118.x);
  FPError::FPError(&local_60,local_210.d.y,local_118.y);
  FPError::FPError(&local_78,local_210.d.z,local_118.z);
  FPError::operator*(&local_1d8,&local_48,&local_48);
  FPError::operator*(&local_228,&local_60,&local_60);
  FPError::operator+(&local_160,&local_1d8,&local_228);
  FPError::operator*(&local_248,&local_78,&local_78);
  pSVar4 = local_230;
  FPError::operator+(&local_148,&local_160,&local_248);
  FPError::operator*(&local_248,&local_1a8,&local_48);
  FPError::operator*(&local_178,&local_1c0,&local_60);
  FPError::operator+(&local_228,&local_248,&local_178);
  FPError::operator*(&local_190,&local_130,&local_78);
  FPError::operator+(&local_1d8,&local_228,&local_190);
  operator*(&local_160,2.0,&local_1d8);
  FPError::operator*(&local_178,&local_1a8,&local_1a8);
  FPError::operator*(&local_190,&local_1c0,&local_1c0);
  FPError::operator+(&local_248,&local_178,&local_190);
  FPError::operator*(&local_90,&local_130,&local_130);
  FPError::operator+(&local_228,&local_248,&local_90);
  local_d8.v = pSVar4->radius;
  local_d8.lBound = local_d8.v;
  local_d8.uBound = local_d8.v;
  local_c0.v = local_d8.v;
  local_c0.lBound = local_d8.v;
  local_c0.uBound = local_d8.v;
  FPError::operator*(&local_a8,&local_c0,&local_d8);
  FPError::operator-(&local_1d8,&local_228,&local_a8);
  a_00.lBound = local_148.lBound;
  a_00.v = local_148.v;
  a_00.uBound = local_148.uBound;
  b_00.lBound = local_160.lBound;
  b_00.v = local_160.v;
  b_00.uBound = local_160.uBound;
  c_00.lBound = local_1d8.lBound;
  c_00.v = local_1d8.v;
  c_00.uBound = local_1d8.uBound;
  bVar5 = solveQuadraticSystem(a_00,b_00,c_00,&local_228,&local_248);
  if (bVar5) {
    if (local_210.tMax < local_228.uBound) {
      return false;
    }
    if (local_248.lBound <= 0.0) {
      return false;
    }
    pFVar6 = &local_228;
    if ((0.0 < local_228.lBound) ||
       (pFVar6 = &local_248, local_228.uBound = local_248.uBound, local_248.uBound <= local_210.tMax
       )) {
      dVar1 = pFVar6->v;
      dVar7 = dVar1 * local_210.d.x + local_210.o.x;
      dVar8 = dVar1 * local_210.d.y + local_210.o.y;
      dVar9 = dVar1 * local_210.d.z + local_210.o.z;
      dVar2 = pSVar4->radius;
      dVar3 = pSVar4->zMin;
      dVar9 = (dVar2 / SQRT(dVar9 * dVar9 + dVar7 * dVar7 + dVar8 * dVar8)) * dVar9;
      if (((-dVar2 < dVar3) && (dVar9 < dVar3)) ||
         ((pSVar4->zMax < dVar2 && (pSVar4->zMax < dVar9)))) {
        if (local_210.tMax < local_228.uBound) {
          return false;
        }
        if ((dVar1 == local_248.v) && (!NAN(dVar1) && !NAN(local_248.v))) {
          return false;
        }
        local_210.o.x = local_210.o.x + local_210.d.x * local_248.v;
        local_210.o.y = local_210.o.y + local_210.d.y * local_248.v;
        local_210.o.z = local_210.o.z + local_210.d.z * local_248.v;
        local_210.o.z =
             (dVar2 / SQRT(local_210.o.z * local_210.o.z +
                           local_210.o.x * local_210.o.x + local_210.o.y * local_210.o.y)) *
             local_210.o.z;
        if ((-dVar2 < dVar3) && (local_210.o.z < dVar3)) {
          return false;
        }
        if ((pSVar4->zMax < dVar2) && (pSVar4->zMax < local_210.o.z)) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError t0 = t1;
    if (t0.lowerBound() <= 0) {
        t0 = t2; if (t0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(t0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (t0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (t0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        t0 = t2; hpt = lr(Real(t0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    return true;
}